

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftType.cpp
# Opt level: O1

void __thiscall ShiftType::ShiftType(ShiftType *this,string *id,int *min,int *max)

{
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->forbiddenSucceedingShiftTypes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->forbiddenSucceedingShiftTypes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->forbiddenSucceedingShiftTypes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)this);
  this->minimumNumberOfConsecutiveAssignments = *min;
  this->maximumNumberOfConsecutiveAssignments = *max;
  return;
}

Assistant:

ShiftType::ShiftType(const string &id, const int &min, const int &max) {
    this->id = id;
    minimumNumberOfConsecutiveAssignments = min;
    maximumNumberOfConsecutiveAssignments = max;
}